

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O2

void __thiscall
MissingDependencyScannerTestCyclicMissingDep::MissingDependencyScannerTestCyclicMissingDep
          (MissingDependencyScannerTestCyclicMissingDep *this)

{
  MissingDependencyScannerTest::MissingDependencyScannerTest
            (&this->super_MissingDependencyScannerTest);
  (this->super_MissingDependencyScannerTest).super_Test._vptr_Test =
       (_func_int **)&PTR__MissingDependencyScannerTest_001e5a08;
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, CyclicMissingDep) {
  CreateInitialState();
  RecordDepsLogDep("generated_header", "compiled_object");
  RecordDepsLogDep("compiled_object", "generated_header");
  // In case of a cycle, both paths are reported (and there is
  // no way to fix the issue by adding deps).
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(2u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(2u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
  AssertMissingDependencyBetween("generated_header", "compiled_object",
                                 &compile_rule_);
}